

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm(char *p,char *s,wchar_t flags)

{
  char cVar1;
  char *pcVar2;
  wchar_t wVar3;
  char *pcVar4;
  wchar_t in_EDX;
  char *in_RSI;
  char *in_RDI;
  char *end;
  wchar_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined4 uVar6;
  char *in_stack_ffffffffffffffd8;
  char *local_18;
  char *local_10;
  wchar_t local_4;
  
  local_18 = in_RSI;
  if ((*in_RSI == '.') && (in_RSI[1] == '/')) {
    local_18 = pm_slashskip(in_RSI + 1);
  }
  local_10 = in_RDI;
  if ((*in_RDI == '.') && (in_RDI[1] == '/')) {
    local_10 = pm_slashskip(in_RDI + 1);
  }
  do {
    cVar1 = *local_10;
    if (cVar1 == '\0') {
      if (*local_18 == '/') {
        if ((in_EDX & 2U) != 0) {
          return L'\x01';
        }
        local_18 = pm_slashskip(local_18);
      }
      return (uint)(*local_18 == '\0');
    }
    if (cVar1 == '$') {
      if ((local_10[1] == '\0') && ((in_EDX & 2U) != 0)) {
        pcVar4 = pm_slashskip(local_18);
        return (uint)(*pcVar4 == '\0');
      }
LAB_00119f72:
      if (*local_10 != *local_18) {
        return L'\0';
      }
    }
    else {
      if (cVar1 == '*') {
        for (; *local_10 == '*'; local_10 = local_10 + 1) {
        }
        if (*local_10 == '\0') {
          local_4 = L'\x01';
        }
        else {
          uVar6 = 0x2a;
          for (; *local_18 != '\0'; local_18 = local_18 + 1) {
            wVar3 = __archive_pathmatch(in_stack_ffffffffffffffd8,
                                        (char *)CONCAT44(uVar6,in_stack_ffffffffffffffd0),
                                        in_stack_ffffffffffffffcc);
            if (wVar3 != L'\0') {
              return L'\x01';
            }
          }
          local_4 = L'\0';
        }
        return local_4;
      }
      if (cVar1 == '/') {
        if ((*local_18 != '/') && (*local_18 != '\0')) {
          return L'\0';
        }
        local_10 = pm_slashskip(local_10);
        local_18 = pm_slashskip(local_18);
        if ((*local_10 == '\0') && ((in_EDX & 2U) != 0)) {
          return L'\x01';
        }
        local_10 = local_10 + -1;
        local_18 = local_18 + -1;
      }
      else if (cVar1 == '?') {
        if (*local_18 == '\0') {
          return L'\0';
        }
      }
      else {
        uVar5 = in_stack_ffffffffffffffd0;
        pcVar4 = local_10;
        if (cVar1 == '[') {
          while( true ) {
            pcVar2 = pcVar4;
            in_stack_ffffffffffffffd8 = pcVar2 + 1;
            in_stack_ffffffffffffffd0 = uVar5 & 0xffffff;
            if (*in_stack_ffffffffffffffd8 != '\0') {
              in_stack_ffffffffffffffd0 = CONCAT13(*in_stack_ffffffffffffffd8 != ']',(int3)uVar5);
            }
            if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
            uVar5 = in_stack_ffffffffffffffd0;
            pcVar4 = in_stack_ffffffffffffffd8;
            if ((*in_stack_ffffffffffffffd8 == '\\') &&
               (pcVar4 = in_stack_ffffffffffffffd8, pcVar2[2] != '\0')) {
              pcVar4 = pcVar2 + 2;
            }
          }
          if (*in_stack_ffffffffffffffd8 == ']') {
            wVar3 = pm_list(local_10 + 1,in_stack_ffffffffffffffd8,*local_18,in_EDX);
            local_10 = in_stack_ffffffffffffffd8;
            if (wVar3 == L'\0') {
              return L'\0';
            }
          }
          else if (*local_10 != *local_18) {
            return L'\0';
          }
        }
        else {
          if (cVar1 != '\\') goto LAB_00119f72;
          if (local_10[1] == '\0') {
            if (*local_18 != '\\') {
              return L'\0';
            }
          }
          else {
            local_10 = local_10 + 1;
            if (*local_10 != *local_18) {
              return L'\0';
            }
          }
        }
      }
    }
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static int
pm(const char *p, const char *s, int flags)
{
	const char *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == '.' && s[1] == '/')
		s = pm_slashskip(s + 1);
	if (p[0] == '.' && p[1] == '/')
		p = pm_slashskip(p + 1);

	for (;;) {
		switch (*p) {
		case '\0':
			if (s[0] == '/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip(s);
			}
			return (*s == '\0');
		case '?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == '\0')
				return (0);
			break;
		case '*':
			/* "*" == "**" == "***" ... */
			while (*p == '*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == '\0')
				return (1);
			while (*s) {
				if (archive_pathmatch(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case '[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != '\0' && *end != ']') {
				if (*end == '\\' && end[1] != '\0')
					++end;
				++end;
			}
			if (*end == ']') {
				/* We found [...], try to match it. */
				if (!pm_list(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case '\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == '\0') {
				if (*s != '\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case '/':
			if (*s != '/' && *s != '\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip(p);
			s = pm_slashskip(s);
			if (*p == '\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case '$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == '\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip(s) == '\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}